

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O2

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
VerifyQueueSlots(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                 *this)

{
  _Vector_base<short,_std::allocator<short>_> *p_Var1;
  _Vector_base<short,_std::allocator<short>_> *p_Var2;
  ostream *poVar3;
  pointer pvVar4;
  CritScope cs;
  CritScope CStack_188;
  FatalMessage local_180;
  
  rtc::CritScope::CritScope(&CStack_188,&this->crit_queue_);
  pvVar4 = (this->queue_).
           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pvVar4 == (this->queue_).
                  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      rtc::CritScope::~CritScope(&CStack_188);
      return true;
    }
    p_Var1 = &pvVar4->super__Vector_base<short,_std::allocator<short>_>;
    p_Var2 = &pvVar4->super__Vector_base<short,_std::allocator<short>_>;
    pvVar4 = pvVar4 + 1;
  } while ((this->queue_item_verifier_).minimum_capacity_ <=
           (ulong)((long)(p_Var1->_M_impl).super__Vector_impl_data._M_end_of_storage -
                   (long)(p_Var2->_M_impl).super__Vector_impl_data._M_start >> 1));
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
             ,0xb9);
  poVar3 = std::operator<<((ostream *)&local_180,"Check failed: queue_item_verifier_(v)");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"# ");
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

bool VerifyQueueSlots() {
    rtc::CritScope cs(&crit_queue_);
    for (const auto& v : queue_) {
      RTC_DCHECK(queue_item_verifier_(v));
    }
    return true;
  }